

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamWriter::writeAttribute
          (QXmlStreamWriter *this,QAnyStringView qualifiedName,QAnyStringView value)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  void *pvVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 __n;
  size_t __n_00;
  
  __n = value.field_0;
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>
       .super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl;
  pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x45505b);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x45505b,pvVar1,(size_t)__n);
  QXmlStreamWriterPrivate::write
            (this_00._M_head_impl,qualifiedName.field_0._0_4_,(void *)qualifiedName.m_size,
             (size_t)__n);
  pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,3ul>((char (*) [3])0x4683ff);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x4683ff,pvVar1,(size_t)__n);
  __n_00 = 1;
  QXmlStreamWriterPrivate::writeEscaped(this_00._M_head_impl,value,true);
  pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x466b4f);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x466b4f,pvVar1,__n_00);
  (this_00._M_head_impl)->field_0x79 = (this_00._M_head_impl)->field_0x79 | 2;
  return;
}

Assistant:

void QXmlStreamWriter::writeAttribute(QAnyStringView qualifiedName, QAnyStringView value)
{
    Q_D(QXmlStreamWriter);
    Q_ASSERT(d->inStartElement);
    Q_ASSERT(count(qualifiedName, ':') <= 1);
    d->write(" ");
    d->write(qualifiedName);
    d->write("=\"");
    d->writeEscaped(value, true);
    d->write("\"");
    d->didWriteAnyToken = true;
}